

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O3

bool __thiscall
ccs::ast::Import::resolveImports
          (Import *this,ImportResolver *importResolver,Loader *loader,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *inProgress)

{
  string *__x;
  CcsTracer *pCVar1;
  pointer pbVar2;
  pointer pcVar3;
  char cVar4;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  ostream *poVar6;
  ostringstream msg;
  long *local_1e8 [2];
  long local_1d8 [2];
  undefined8 *local_1c8;
  undefined8 local_1c0;
  code *local_1b8;
  code *local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  __x = &this->location;
  _Var5 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    ((inProgress->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
                     (inProgress->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish,__x);
  if (_Var5._M_current ==
      (inProgress->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(inProgress,__x);
    local_1c0 = 0;
    local_1c8 = (undefined8 *)operator_new(0x20);
    *local_1c8 = loader;
    local_1c8[1] = this;
    local_1c8[2] = importResolver;
    local_1c8[3] = inProgress;
    local_1b0 = std::
                _Function_handler<bool_(std::basic_istream<char,_std::char_traits<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/src/parser/ast.cpp:35:9)>
                ::_M_invoke;
    local_1b8 = std::
                _Function_handler<bool_(std::basic_istream<char,_std::char_traits<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/src/parser/ast.cpp:35:9)>
                ::_M_manager;
    cVar4 = (**(code **)(*(long *)importResolver + 0x10))(importResolver,__x,&local_1c8);
    if (local_1b8 != (code *)0x0) {
      (*local_1b8)(&local_1c8,&local_1c8,3);
    }
    pbVar2 = (inProgress->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    (inProgress->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = pbVar2 + -1;
    pcVar3 = pbVar2[-1]._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != &pbVar2[-1].field_2) {
      operator_delete(pcVar3,pbVar2[-1].field_2._M_allocated_capacity + 1);
    }
    if (cVar4 != '\0') {
      return true;
    }
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Failed to resolve \'",0x13);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(this->location)._M_dataplus._M_p,
                        (this->location)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"\'! (User-provided resolver returned false.)",0x2b);
    pCVar1 = loader->trace;
    std::__cxx11::stringbuf::str();
    (*pCVar1->_vptr_CcsTracer[5])(pCVar1,local_1e8);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Circular import detected involving \'",0x24);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(this->location)._M_dataplus._M_p,
                        (this->location)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\'",1);
    pCVar1 = loader->trace;
    std::__cxx11::stringbuf::str();
    (*pCVar1->_vptr_CcsTracer[5])(pCVar1,local_1e8);
  }
  if (local_1e8[0] != local_1d8) {
    operator_delete(local_1e8[0],local_1d8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return false;
}

Assistant:

bool Import::resolveImports(ImportResolver &importResolver, Loader &loader,
    std::vector<std::string> &inProgress) {
  bool result = false;
  if (std::find(inProgress.begin(), inProgress.end(), location) !=
      inProgress.end()) {
    std::ostringstream msg;
    msg << "Circular import detected involving '" << location << "'";
    loader.tracer().onParseError(msg.str());
  } else {
    inProgress.push_back(location);
    result = importResolver.resolve(location,
        [&](std::istream &stream) {
      return loader.parseCcsStream(stream, location,
          importResolver, inProgress, ast);
    });
    inProgress.pop_back();
    if (!result) {
      std::ostringstream msg;
      msg << "Failed to resolve '" << location
        << "'! (User-provided resolver returned false.)";
      loader.tracer().onParseError(msg.str());
    }
  }
  return result;
}